

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O2

void av1_convolve_x_sr_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  __m128i alVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 uVar26;
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined3 uVar39;
  undefined1 auVar40 [15];
  undefined3 uVar41;
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [11];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [11];
  undefined1 auVar71 [15];
  undefined1 auVar72 [11];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [15];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  uint uVar92;
  long lVar93;
  int j;
  ulong uVar94;
  undefined1 (*pauVar95) [16];
  uint8_t *puVar96;
  undefined2 uVar97;
  uint3 uVar98;
  int extraout_XMM0_Da;
  int extraout_XMM0_Da_00;
  int extraout_XMM0_Da_01;
  undefined8 extraout_XMM0_Qa;
  int extraout_XMM0_Db_01;
  int extraout_XMM0_Dc;
  int extraout_XMM0_Dc_01;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  int iVar99;
  int iVar100;
  int extraout_XMM0_Db;
  int extraout_XMM0_Dd;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  int extraout_XMM0_Db_00;
  int extraout_XMM0_Dc_00;
  int extraout_XMM0_Dd_00;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined8 extraout_XMM0_Qb;
  int extraout_XMM0_Dd_01;
  undefined4 uVar114;
  undefined1 uVar115;
  undefined4 uVar116;
  undefined1 auVar113 [16];
  ushort uVar120;
  ushort uVar121;
  undefined1 uVar122;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 uVar124;
  undefined1 uVar125;
  undefined1 auVar123 [16];
  undefined1 auVar126 [12];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  __m128i s [4];
  __m128i coeffs [4];
  uint7 uVar101;
  undefined1 auVar102 [11];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar103 [15];
  undefined1 auVar110 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  
  uVar120 = filter_params_x->taps;
  if (uVar120 < 9) {
    pauVar95 = (undefined1 (*) [16])(src + (1 - (ulong)(uVar120 >> 1)));
    uVar92 = 7 - conv_params->round_0;
    iVar99 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    iVar100 = (1 << ((byte)uVar92 & 0x1f)) >> 1;
    auVar104 = ZEXT416((uint)conv_params->round_0);
    auVar106 = ZEXT416(uVar92);
    prepare_coeffs(filter_params_x,subpel_x_qn,coeffs);
    if (w < 5) {
      do {
        auVar112 = *pauVar95;
        auVar30[0xd] = 0;
        auVar30._0_13_ = auVar112._0_13_;
        auVar30[0xe] = auVar112[7];
        auVar34[0xc] = auVar112[6];
        auVar34._0_12_ = auVar112._0_12_;
        auVar34._13_2_ = auVar30._13_2_;
        uVar39 = auVar34._12_3_;
        auVar40[0xb] = 0;
        auVar40._0_11_ = auVar112._0_11_;
        auVar40._12_3_ = uVar39;
        auVar47[10] = auVar112[5];
        auVar47._0_10_ = auVar112._0_10_;
        auVar47._11_4_ = auVar40._11_4_;
        auVar53[9] = 0;
        auVar53._0_9_ = auVar112._0_9_;
        auVar53._10_5_ = auVar47._10_5_;
        auVar58[8] = auVar112[4];
        auVar58._0_8_ = auVar112._0_8_;
        auVar58._9_6_ = auVar53._9_6_;
        auVar127[7] = 0;
        auVar127._0_7_ = auVar58._8_7_;
        auVar69._7_8_ = 0;
        auVar69._0_7_ = auVar58._8_7_;
        auVar82._1_8_ = SUB158(auVar69 << 0x40,7);
        auVar82[0] = auVar112[3];
        auVar82._9_6_ = 0;
        auVar70._1_10_ = SUB1510(auVar82 << 0x30,5);
        auVar70[0] = auVar112[2];
        auVar83._11_4_ = 0;
        auVar83._0_11_ = auVar70;
        auVar67._3_12_ = SUB1512(auVar83 << 0x20,3);
        auVar67[2] = auVar112[1];
        auVar67[1] = 0;
        auVar67[0] = auVar112[0];
        uVar114 = auVar70._0_4_;
        uVar116 = auVar58._8_4_;
        auVar117._4_4_ = uVar114;
        auVar117._0_4_ = auVar67._0_4_;
        auVar117._8_4_ = uVar116;
        auVar117._12_4_ = uVar114;
        auVar118 = pshuflw(auVar117,auVar117,0x94);
        auVar118 = pshufhw(auVar118,auVar118,0x3e);
        uVar98 = CONCAT12(auVar112[9],(ushort)auVar112[8]);
        uVar101 = CONCAT16(auVar112[0xb],(uint6)CONCAT14(auVar112[10],CONCAT13(0,uVar98)));
        auVar102._0_8_ = CONCAT17(0,uVar101);
        auVar102[8] = auVar112[0xc];
        auVar102[9] = 0;
        auVar102[10] = auVar112[0xd];
        auVar103[0xb] = 0;
        auVar103._0_11_ = auVar102;
        auVar103[0xc] = auVar112[0xe];
        auVar103[0xd] = 0;
        auVar103[0xe] = auVar112[0xf];
        auVar123._4_4_ = uVar114;
        auVar123._0_4_ = uVar116;
        auVar123._8_4_ = uVar116;
        auVar123._12_3_ = uVar39;
        auVar123[0xf] = 0;
        uVar41 = (undefined3)(uVar101 >> 0x20);
        auVar127._8_3_ = uVar98;
        auVar127[0xb] = 0;
        auVar127._12_3_ = uVar39;
        auVar127[0xf] = 0;
        auVar112 = pshuflw(auVar127,auVar127,0x94);
        auVar128 = pshufhw(auVar112,auVar112,0x3e);
        sVar2 = auVar118._0_2_;
        sVar3 = auVar118._2_2_;
        s[0][0]._1_1_ = (0 < sVar3) * (sVar3 < 0x100) * auVar118[2] - (0xff < sVar3);
        s[0][0]._0_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar118[0] - (0xff < sVar2);
        sVar2 = auVar118._4_2_;
        s[0][0]._2_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar118[4] - (0xff < sVar2);
        sVar2 = auVar118._6_2_;
        s[0][0]._3_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar118[6] - (0xff < sVar2);
        sVar2 = auVar118._8_2_;
        s[0][0]._4_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar118[8] - (0xff < sVar2);
        sVar2 = auVar118._10_2_;
        s[0][0]._5_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar118[10] - (0xff < sVar2);
        sVar2 = auVar118._12_2_;
        s[0][0]._6_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar118[0xc] - (0xff < sVar2);
        sVar2 = auVar118._14_2_;
        s[0][0]._7_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar118[0xe] - (0xff < sVar2);
        sVar10 = auVar128._0_2_;
        s[0][1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar128[0] - (0xff < sVar10);
        sVar12 = auVar128._2_2_;
        s[0][1]._1_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar128[2] - (0xff < sVar12);
        sVar14 = auVar128._4_2_;
        s[0][1]._2_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar128[4] - (0xff < sVar14);
        sVar16 = auVar128._6_2_;
        s[0][1]._3_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar128[6] - (0xff < sVar16);
        sVar18 = auVar128._8_2_;
        s[0][1]._4_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar128[8] - (0xff < sVar18);
        sVar20 = auVar128._10_2_;
        s[0][1]._5_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar128[10] - (0xff < sVar20);
        sVar22 = auVar128._12_2_;
        s[0][1]._6_1_ = (0 < sVar22) * (sVar22 < 0x100) * auVar128[0xc] - (0xff < sVar22);
        sVar24 = auVar128._14_2_;
        s[0][1]._7_1_ = (0 < sVar24) * (sVar24 < 0x100) * auVar128[0xe] - (0xff < sVar24);
        auVar113._4_3_ = uVar39;
        auVar113._0_4_ = CONCAT13(0,uVar98);
        auVar113[7] = 0;
        auVar113._8_3_ = uVar98;
        auVar113[0xb] = 0;
        auVar113._12_3_ = uVar41;
        auVar113[0xf] = 0;
        auVar112 = pshuflw(auVar113,auVar113,0x3e);
        auVar118 = pshufhw(auVar112,auVar112,0x94);
        auVar112 = pshuflw((undefined1  [16])s[0],auVar123,0x3e);
        auVar112 = pshufhw(auVar112,auVar112,0x94);
        sVar2 = auVar112._0_2_;
        sVar3 = auVar112._2_2_;
        sVar4 = auVar112._4_2_;
        sVar5 = auVar112._6_2_;
        sVar6 = auVar112._8_2_;
        sVar7 = auVar112._10_2_;
        sVar8 = auVar112._12_2_;
        sVar9 = auVar112._14_2_;
        sVar11 = auVar118._0_2_;
        sVar13 = auVar118._2_2_;
        sVar15 = auVar118._4_2_;
        sVar17 = auVar118._6_2_;
        sVar19 = auVar118._8_2_;
        sVar21 = auVar118._10_2_;
        sVar23 = auVar118._12_2_;
        sVar25 = auVar118._14_2_;
        s[1][0]._1_1_ = (0 < sVar3) * (sVar3 < 0x100) * auVar112[2] - (0xff < sVar3);
        s[1][0]._0_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar112[0] - (0xff < sVar2);
        s[1][0]._2_1_ = (0 < sVar4) * (sVar4 < 0x100) * auVar112[4] - (0xff < sVar4);
        s[1][0]._3_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar112[6] - (0xff < sVar5);
        s[1][0]._4_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar112[8] - (0xff < sVar6);
        s[1][0]._5_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar112[10] - (0xff < sVar7);
        s[1][0]._6_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar112[0xc] - (0xff < sVar8);
        s[1][0]._7_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar112[0xe] - (0xff < sVar9);
        s[1][1]._0_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar118[0] - (0xff < sVar11);
        s[1][1]._1_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar118[2] - (0xff < sVar13);
        s[1][1]._2_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar118[4] - (0xff < sVar15);
        s[1][1]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar118[6] - (0xff < sVar17);
        s[1][1]._4_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar118[8] - (0xff < sVar19);
        s[1][1]._5_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar118[10] - (0xff < sVar21);
        s[1][1]._6_1_ = (0 < sVar23) * (sVar23 < 0x100) * auVar118[0xc] - (0xff < sVar23);
        s[1][1]._7_1_ = (0 < sVar25) * (sVar25 < 0x100) * auVar118[0xe] - (0xff < sVar25);
        uVar98 = auVar102._8_3_;
        auVar105[3] = 0;
        auVar105._0_3_ = uVar98;
        auVar119._8_3_ = uVar98;
        auVar119._0_8_ = auVar102._0_8_;
        auVar119[0xb] = 0;
        auVar119._12_3_ = uVar41;
        auVar119[0xf] = 0;
        auVar112 = pshuflw(auVar119,auVar119,0x94);
        auVar112 = pshufhw(auVar112,auVar112,0x3e);
        sVar2 = auVar112._0_2_;
        sVar3 = auVar112._2_2_;
        sVar4 = auVar112._4_2_;
        sVar5 = auVar112._6_2_;
        sVar6 = auVar112._8_2_;
        sVar7 = auVar112._10_2_;
        sVar8 = auVar112._12_2_;
        sVar9 = auVar112._14_2_;
        s[2][0]._1_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar128[2] - (0xff < sVar12);
        s[2][0]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar128[0] - (0xff < sVar10);
        s[2][0]._2_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar128[4] - (0xff < sVar14);
        s[2][0]._3_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar128[6] - (0xff < sVar16);
        s[2][0]._4_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar128[8] - (0xff < sVar18);
        s[2][0]._5_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar128[10] - (0xff < sVar20);
        s[2][0]._6_1_ = (0 < sVar22) * (sVar22 < 0x100) * auVar128[0xc] - (0xff < sVar22);
        s[2][0]._7_1_ = (0 < sVar24) * (sVar24 < 0x100) * auVar128[0xe] - (0xff < sVar24);
        s[2][1]._0_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar112[0] - (0xff < sVar2);
        s[2][1]._1_1_ = (0 < sVar3) * (sVar3 < 0x100) * auVar112[2] - (0xff < sVar3);
        s[2][1]._2_1_ = (0 < sVar4) * (sVar4 < 0x100) * auVar112[4] - (0xff < sVar4);
        s[2][1]._3_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar112[6] - (0xff < sVar5);
        s[2][1]._4_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar112[8] - (0xff < sVar6);
        s[2][1]._5_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar112[10] - (0xff < sVar7);
        s[2][1]._6_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar112[0xc] - (0xff < sVar8);
        s[2][1]._7_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar112[0xe] - (0xff < sVar9);
        auVar105._4_3_ = uVar41;
        auVar105[7] = 0;
        auVar105._8_3_ = uVar98;
        auVar105[0xb] = 0;
        auVar105._12_3_ = auVar103._12_3_;
        auVar105[0xf] = 0;
        auVar112 = pshuflw(auVar105,auVar105,0x3e);
        auVar112 = pshufhw(auVar112,auVar112,0x94);
        sVar2 = auVar112._0_2_;
        sVar3 = auVar112._2_2_;
        sVar4 = auVar112._4_2_;
        sVar5 = auVar112._6_2_;
        sVar6 = auVar112._8_2_;
        sVar7 = auVar112._10_2_;
        sVar8 = auVar112._12_2_;
        sVar9 = auVar112._14_2_;
        s[3][0]._1_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar118[2] - (0xff < sVar13);
        s[3][0]._0_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar118[0] - (0xff < sVar11);
        s[3][0]._2_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar118[4] - (0xff < sVar15);
        s[3][0]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar118[6] - (0xff < sVar17);
        s[3][0]._4_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar118[8] - (0xff < sVar19);
        s[3][0]._5_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar118[10] - (0xff < sVar21);
        s[3][0]._6_1_ = (0 < sVar23) * (sVar23 < 0x100) * auVar118[0xc] - (0xff < sVar23);
        s[3][0]._7_1_ = (0 < sVar25) * (sVar25 < 0x100) * auVar118[0xe] - (0xff < sVar25);
        s[3][1]._0_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar112[0] - (0xff < sVar2);
        s[3][1]._1_1_ = (0 < sVar3) * (sVar3 < 0x100) * auVar112[2] - (0xff < sVar3);
        s[3][1]._2_1_ = (0 < sVar4) * (sVar4 < 0x100) * auVar112[4] - (0xff < sVar4);
        s[3][1]._3_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar112[6] - (0xff < sVar5);
        s[3][1]._4_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar112[8] - (0xff < sVar6);
        s[3][1]._5_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar112[10] - (0xff < sVar7);
        s[3][1]._6_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar112[0xc] - (0xff < sVar8);
        s[3][1]._7_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar112[0xe] - (0xff < sVar9);
        convolve_lo_x(s,coeffs);
        auVar128._0_4_ = (extraout_XMM0_Da + iVar99 >> auVar104) + iVar100 >> auVar106;
        auVar128._4_4_ = (extraout_XMM0_Db + iVar99 >> auVar104) + iVar100 >> auVar106;
        auVar128._8_4_ = (extraout_XMM0_Dc + iVar99 >> auVar104) + iVar100 >> auVar106;
        auVar128._12_4_ = (extraout_XMM0_Dd + iVar99 >> auVar104) + iVar100 >> auVar106;
        auVar112 = packssdw(auVar128,auVar128);
        sVar2 = auVar112._0_2_;
        sVar3 = auVar112._2_2_;
        uVar97 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar112[2] - (0xff < sVar3),
                          (0 < sVar2) * (sVar2 < 0x100) * auVar112[0] - (0xff < sVar2));
        sVar2 = auVar112._4_2_;
        sVar3 = auVar112._6_2_;
        if (w == 2) {
          *(undefined2 *)dst = uVar97;
        }
        else {
          *(uint *)dst = CONCAT13((0 < sVar3) * (sVar3 < 0x100) * auVar112[6] - (0xff < sVar3),
                                  CONCAT12((0 < sVar2) * (sVar2 < 0x100) * auVar112[4] -
                                           (0xff < sVar2),uVar97));
        }
        pauVar95 = (undefined1 (*) [16])(*pauVar95 + src_stride);
        dst = dst + dst_stride;
        h = h + -1;
      } while (h != 0);
    }
    else {
      lVar93 = 0;
      do {
        uVar94 = 0;
        do {
          alVar1 = *(__m128i *)(*pauVar95 + uVar94);
          s[1] = (__m128i)((undefined1  [16])alVar1 >> 0x10);
          s[2] = (__m128i)((undefined1  [16])alVar1 >> 0x20);
          s[3] = (__m128i)((undefined1  [16])alVar1 >> 0x30);
          s[0] = alVar1;
          convolve_lo_x(s,coeffs);
          s[0] = (__m128i)((undefined1  [16])alVar1 >> 8);
          s[1] = (__m128i)((undefined1  [16])alVar1 >> 0x18);
          s[2] = (__m128i)((undefined1  [16])alVar1 >> 0x28);
          s[3] = (__m128i)((undefined1  [16])alVar1 >> 0x38);
          convolve_lo_x(s,coeffs);
          local_118 = (int)extraout_XMM0_Qa;
          iStack_114 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
          iStack_110 = (int)extraout_XMM0_Qb;
          iStack_10c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
          auVar112._0_4_ = (local_118 + iVar99 >> auVar104) + iVar100 >> auVar106;
          auVar112._4_4_ = (extraout_XMM0_Da_01 + iVar99 >> auVar104) + iVar100 >> auVar106;
          auVar112._8_4_ = (iStack_114 + iVar99 >> auVar104) + iVar100 >> auVar106;
          auVar112._12_4_ = (extraout_XMM0_Db_01 + iVar99 >> auVar104) + iVar100 >> auVar106;
          auVar118._0_4_ = (iStack_110 + iVar99 >> auVar104) + iVar100 >> auVar106;
          auVar118._4_4_ = (extraout_XMM0_Dc_01 + iVar99 >> auVar104) + iVar100 >> auVar106;
          auVar118._8_4_ = (iStack_10c + iVar99 >> auVar104) + iVar100 >> auVar106;
          auVar118._12_4_ = (extraout_XMM0_Dd_01 + iVar99 >> auVar104) + iVar100 >> auVar106;
          auVar112 = packssdw(auVar112,auVar118);
          sVar2 = auVar112._0_2_;
          sVar3 = auVar112._2_2_;
          sVar4 = auVar112._4_2_;
          sVar5 = auVar112._6_2_;
          sVar6 = auVar112._8_2_;
          sVar7 = auVar112._10_2_;
          sVar8 = auVar112._12_2_;
          sVar9 = auVar112._14_2_;
          *(ulong *)(dst + uVar94) =
               CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar112[0xe] - (0xff < sVar9),
                        CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar112[0xc] - (0xff < sVar8),
                                 CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar112[10] -
                                          (0xff < sVar7),
                                          CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar112[8] -
                                                   (0xff < sVar6),
                                                   CONCAT13((0 < sVar5) * (sVar5 < 0x100) *
                                                            auVar112[6] - (0xff < sVar5),
                                                            CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                                     auVar112[4] - (0xff < sVar4),
                                                                     CONCAT11((0 < sVar3) *
                                                                              (sVar3 < 0x100) *
                                                                              auVar112[2] -
                                                                              (0xff < sVar3),
                                                                              (0 < sVar2) *
                                                                              (sVar2 < 0x100) *
                                                                              auVar112[0] -
                                                                              (0xff < sVar2))))))));
          uVar94 = uVar94 + 8;
        } while (uVar94 < (uint)w);
        lVar93 = lVar93 + 1;
        pauVar95 = (undefined1 (*) [16])(*pauVar95 + src_stride);
        dst = dst + dst_stride;
      } while (lVar93 < h);
    }
  }
  else {
    if (w < 4) {
      av1_convolve_x_sr_c(src,src_stride,dst,dst_stride,w,h,filter_params_x,subpel_x_qn,conv_params)
      ;
      return;
    }
    puVar96 = src + (1 - (ulong)(uVar120 >> 1));
    uVar92 = 7 - conv_params->round_0;
    iVar99 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    iVar100 = (1 << ((byte)uVar92 & 0x1f)) >> 1;
    auVar104 = ZEXT416((uint)conv_params->round_0);
    auVar106 = ZEXT416(uVar92);
    prepare_coeffs_12tap(filter_params_x,subpel_x_qn,s);
    lVar93 = 0;
    do {
      uVar94 = 0;
      do {
        auVar112 = *(undefined1 (*) [16])(puVar96 + uVar94);
        uVar26 = auVar112[7];
        uVar121 = auVar112._6_2_;
        auVar27._12_2_ = uVar121;
        auVar27._0_12_ = auVar112._0_12_;
        auVar27[0xe] = uVar26;
        auVar28._10_2_ = auVar112._5_2_;
        auVar28._0_10_ = auVar112._0_10_;
        auVar28._12_3_ = auVar27._12_3_;
        uVar120 = auVar112._4_2_;
        auVar29._8_2_ = uVar120;
        auVar29._0_8_ = auVar112._0_8_;
        auVar29._10_5_ = auVar28._10_5_;
        auVar71._2_7_ = auVar29._8_7_;
        auVar71._0_2_ = auVar112._3_2_;
        auVar71._9_6_ = 0;
        auVar42._11_4_ = 0;
        auVar42._0_11_ = SUB1511(auVar71 << 0x30,4);
        auVar42 = auVar42 << 0x20;
        auVar72[4] = uVar26;
        auVar72._2_2_ = uVar121;
        auVar72._0_2_ = auVar112._5_2_;
        auVar72._5_6_ = 0;
        uVar101 = SUB117(auVar72 << 0x30,4);
        auVar48._7_4_ = 0;
        auVar48._0_7_ = uVar101;
        auVar48 = auVar48 << 0x20;
        auVar126._0_8_ = auVar112._4_8_;
        auVar126._8_4_ = auVar112._8_4_;
        auVar132._12_2_ = auVar112._10_2_;
        auVar132._0_12_ = auVar126;
        auVar132._14_2_ = auVar112._11_2_;
        auVar131._12_4_ = auVar132._12_4_;
        auVar131._0_10_ = auVar126._0_10_;
        auVar131._10_2_ = auVar112._9_2_;
        auVar130._10_6_ = auVar131._10_6_;
        auVar130._8_2_ = auVar112._8_2_;
        auVar130._0_8_ = auVar126._0_8_;
        auVar73._2_8_ = auVar130._8_8_;
        auVar73._0_2_ = auVar112._7_2_;
        auVar73._10_6_ = 0;
        auVar129._12_4_ = 0;
        auVar129._0_12_ = SUB1612(auVar73 << 0x30,4);
        auVar129 = auVar129 << 0x20;
        auVar110._0_12_ = auVar112._4_12_ >> 0x10;
        auVar110._12_2_ = auVar112._12_2_;
        auVar110._14_2_ = auVar112._13_2_;
        auVar109._12_4_ = auVar110._12_4_;
        auVar109._0_10_ = auVar112._6_10_;
        auVar109._10_2_ = auVar112._11_2_;
        auVar108._10_6_ = auVar109._10_6_;
        auVar108._0_8_ = auVar112._6_8_;
        auVar108._8_2_ = auVar112._10_2_;
        auVar74._2_8_ = auVar108._8_8_;
        auVar74._0_2_ = auVar112._9_2_;
        auVar74._10_6_ = 0;
        auVar107._12_4_ = 0;
        auVar107._0_12_ = SUB1612(auVar74 << 0x30,4);
        auVar107 = auVar107 << 0x20;
        uVar122 = auVar112[4];
        auVar35[0xd] = 0;
        auVar35._0_13_ = auVar42._0_13_;
        auVar35[0xe] = uVar122;
        uVar115 = auVar112[3];
        auVar43[0xc] = uVar115;
        auVar43._0_12_ = auVar42._0_12_;
        auVar43._13_2_ = auVar35._13_2_;
        auVar49[0xb] = 0;
        auVar49._0_11_ = auVar42._0_11_;
        auVar49._12_3_ = auVar43._12_3_;
        auVar54[10] = uVar115;
        auVar54._0_10_ = auVar42._0_10_;
        auVar54._11_4_ = auVar49._11_4_;
        auVar59[9] = 0;
        auVar59._0_9_ = auVar42._0_9_;
        auVar59._10_5_ = auVar54._10_5_;
        auVar63[8] = auVar112[2];
        auVar63._0_8_ = auVar42._0_8_;
        auVar63._9_6_ = auVar59._9_6_;
        auVar75._7_8_ = 0;
        auVar75._0_7_ = auVar63._8_7_;
        auVar84._1_8_ = SUB158(auVar75 << 0x40,7);
        auVar84[0] = auVar112[2];
        auVar84._9_6_ = 0;
        auVar85._1_10_ = SUB1510(auVar84 << 0x30,5);
        auVar85[0] = auVar112[1];
        auVar85._11_4_ = 0;
        auVar68[2] = auVar112[1];
        auVar68._0_2_ = auVar112._0_2_;
        auVar68._3_12_ = SUB1512(auVar85 << 0x20,3);
        coeffs[0][0]._0_2_ = auVar112._0_2_ & 0xff;
        coeffs[0]._2_13_ = auVar68._2_13_;
        coeffs[0][1]._7_1_ = 0;
        uVar125 = auVar112[6];
        auVar78._7_7_ = 0;
        auVar78._0_7_ = uVar101;
        auVar31[0xe] = uVar125;
        auVar31._0_14_ = auVar78 << 0x20;
        uVar124 = auVar112[5];
        auVar77._7_5_ = 0;
        auVar77._0_7_ = uVar101;
        auVar36[0xc] = uVar124;
        auVar36._0_12_ = auVar77 << 0x20;
        auVar36._13_2_ = auVar31._13_2_;
        auVar76._7_5_ = 0;
        auVar76._0_7_ = uVar101;
        auVar44._12_3_ = auVar36._12_3_;
        auVar44._0_12_ = auVar76 << 0x20;
        auVar50[10] = uVar124;
        auVar50._0_10_ = auVar48._0_10_;
        auVar50._11_4_ = auVar44._11_4_;
        auVar55[9] = 0;
        auVar55._0_9_ = auVar48._0_9_;
        auVar55._10_5_ = auVar50._10_5_;
        auVar60[8] = uVar122;
        auVar60._0_8_ = auVar48._0_8_;
        auVar60._9_6_ = auVar55._9_6_;
        auVar79._7_8_ = 0;
        auVar79._0_7_ = auVar60._8_7_;
        auVar86._1_8_ = SUB158(auVar79 << 0x40,7);
        auVar86[0] = uVar122;
        auVar86._9_6_ = 0;
        auVar87._1_10_ = SUB1510(auVar86 << 0x30,5);
        auVar87[0] = uVar115;
        auVar87._11_4_ = 0;
        auVar64[2] = uVar115;
        auVar64._0_2_ = auVar112._2_2_;
        auVar64._3_12_ = SUB1512(auVar87 << 0x20,3);
        coeffs[1][0]._0_2_ = auVar112._2_2_ & 0xff;
        coeffs[1]._2_13_ = auVar64._2_13_;
        coeffs[1][1]._7_1_ = 0;
        uVar115 = auVar112[8];
        auVar32[0xd] = 0;
        auVar32._0_13_ = auVar129._0_13_;
        auVar32[0xe] = uVar115;
        auVar37[0xc] = uVar26;
        auVar37._0_12_ = auVar129._0_12_;
        auVar37._13_2_ = auVar32._13_2_;
        auVar45[0xb] = 0;
        auVar45._0_11_ = auVar129._0_11_;
        auVar45._12_3_ = auVar37._12_3_;
        auVar51[10] = uVar26;
        auVar51._0_10_ = auVar129._0_10_;
        auVar51._11_4_ = auVar45._11_4_;
        auVar56[9] = 0;
        auVar56._0_9_ = auVar129._0_9_;
        auVar56._10_5_ = auVar51._10_5_;
        auVar61[8] = uVar125;
        auVar61._0_8_ = auVar129._0_8_;
        auVar61._9_6_ = auVar56._9_6_;
        auVar80._7_8_ = 0;
        auVar80._0_7_ = auVar61._8_7_;
        auVar88._1_8_ = SUB158(auVar80 << 0x40,7);
        auVar88[0] = uVar125;
        auVar88._9_6_ = 0;
        auVar89._1_10_ = SUB1510(auVar88 << 0x30,5);
        auVar89[0] = uVar124;
        auVar89._11_4_ = 0;
        auVar65[2] = uVar124;
        auVar65._0_2_ = uVar120;
        auVar65._3_12_ = SUB1512(auVar89 << 0x20,3);
        coeffs[2][0]._0_2_ = uVar120 & 0xff;
        coeffs[2]._2_13_ = auVar65._2_13_;
        coeffs[2][1]._7_1_ = 0;
        auVar33[0xd] = 0;
        auVar33._0_13_ = auVar107._0_13_;
        auVar33[0xe] = auVar112[10];
        auVar38[0xc] = auVar112[9];
        auVar38._0_12_ = auVar107._0_12_;
        auVar38._13_2_ = auVar33._13_2_;
        auVar46[0xb] = 0;
        auVar46._0_11_ = auVar107._0_11_;
        auVar46._12_3_ = auVar38._12_3_;
        auVar52[10] = auVar112[9];
        auVar52._0_10_ = auVar107._0_10_;
        auVar52._11_4_ = auVar46._11_4_;
        auVar57[9] = 0;
        auVar57._0_9_ = auVar107._0_9_;
        auVar57._10_5_ = auVar52._10_5_;
        auVar62[8] = uVar115;
        auVar62._0_8_ = auVar107._0_8_;
        auVar62._9_6_ = auVar57._9_6_;
        auVar81._7_8_ = 0;
        auVar81._0_7_ = auVar62._8_7_;
        auVar90._1_8_ = SUB158(auVar81 << 0x40,7);
        auVar90[0] = uVar115;
        auVar90._9_6_ = 0;
        auVar91._1_10_ = SUB1510(auVar90 << 0x30,5);
        auVar91[0] = uVar26;
        auVar91._11_4_ = 0;
        auVar66[2] = uVar26;
        auVar66._0_2_ = uVar121;
        auVar66._3_12_ = SUB1512(auVar91 << 0x20,3);
        coeffs[3][0]._0_2_ = uVar121 & 0xff;
        coeffs[3]._2_13_ = auVar66._2_13_;
        coeffs[3][1]._7_1_ = 0;
        convolve_12tap(coeffs,s);
        auVar111._0_4_ = (extraout_XMM0_Da_00 + iVar99 >> auVar104) + iVar100 >> auVar106;
        auVar111._4_4_ = (extraout_XMM0_Db_00 + iVar99 >> auVar104) + iVar100 >> auVar106;
        auVar111._8_4_ = (extraout_XMM0_Dc_00 + iVar99 >> auVar104) + iVar100 >> auVar106;
        auVar111._12_4_ = (extraout_XMM0_Dd_00 + iVar99 >> auVar104) + iVar100 >> auVar106;
        auVar112 = packssdw(auVar111,auVar111);
        sVar2 = auVar112._0_2_;
        sVar3 = auVar112._2_2_;
        sVar4 = auVar112._4_2_;
        sVar5 = auVar112._6_2_;
        *(uint *)(dst + uVar94) =
             CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar112[6] - (0xff < sVar5),
                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar112[4] - (0xff < sVar4),
                               CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar112[2] - (0xff < sVar3)
                                        ,(0 < sVar2) * (sVar2 < 0x100) * auVar112[0] -
                                         (0xff < sVar2))));
        uVar94 = uVar94 + 4;
      } while (uVar94 < (uint)w);
      lVar93 = lVar93 + 1;
      dst = dst + dst_stride;
      puVar96 = puVar96 + src_stride;
    } while (lVar93 < h);
  }
  return;
}

Assistant:

void av1_convolve_x_sr_sse2(const uint8_t *src, int src_stride, uint8_t *dst,
                            int dst_stride, int w, int h,
                            const InterpFilterParams *filter_params_x,
                            const int subpel_x_qn,
                            ConvolveParams *conv_params) {
  if (filter_params_x->taps > 8) {
    if (w < 4) {
      av1_convolve_x_sr_c(src, src_stride, dst, dst_stride, w, h,
                          filter_params_x, subpel_x_qn, conv_params);
    } else {
      convolve_x_sr_12tap_sse2(src, src_stride, dst, dst_stride, w, h,
                               filter_params_x, subpel_x_qn, conv_params);
    }
  } else {
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *src_ptr = src - fo_horiz;
    const int bits = FILTER_BITS - conv_params->round_0;
    const __m128i round_0_const =
        _mm_set1_epi32((1 << conv_params->round_0) >> 1);
    const __m128i round_const = _mm_set1_epi32((1 << bits) >> 1);
    const __m128i round_0_shift = _mm_cvtsi32_si128(conv_params->round_0);
    const __m128i round_shift = _mm_cvtsi32_si128(bits);
    __m128i coeffs[4];

    assert(bits >= 0);
    assert((FILTER_BITS - conv_params->round_1) >= 0 ||
           ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

    prepare_coeffs(filter_params_x, subpel_x_qn, coeffs);

    if (w <= 4) {
      do {
        const __m128i data = _mm_loadu_si128((__m128i *)src_ptr);
        __m128i s[4];

        s[0] = _mm_unpacklo_epi8(data, _mm_srli_si128(data, 1));
        s[1] =
            _mm_unpacklo_epi8(_mm_srli_si128(data, 2), _mm_srli_si128(data, 3));
        s[2] =
            _mm_unpacklo_epi8(_mm_srli_si128(data, 4), _mm_srli_si128(data, 5));
        s[3] =
            _mm_unpacklo_epi8(_mm_srli_si128(data, 6), _mm_srli_si128(data, 7));
        const __m128i res_lo = convolve_lo_x(s, coeffs);
        __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_0_const), round_0_shift);
        res_lo_round = _mm_sra_epi32(_mm_add_epi32(res_lo_round, round_const),
                                     round_shift);

        const __m128i res16 = _mm_packs_epi32(res_lo_round, res_lo_round);
        const __m128i res = _mm_packus_epi16(res16, res16);

        int r = _mm_cvtsi128_si32(res);
        if (w == 2)
          *(uint16_t *)dst = (uint16_t)r;
        else
          *(int *)dst = r;

        src_ptr += src_stride;
        dst += dst_stride;
      } while (--h);
    } else {
      assert(!(w % 8));
      int i = 0;
      do {
        int j = 0;
        do {
          const __m128i data =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          __m128i s[4];

          // Filter even-index pixels
          s[0] = data;
          s[1] = _mm_srli_si128(data, 2);
          s[2] = _mm_srli_si128(data, 4);
          s[3] = _mm_srli_si128(data, 6);
          const __m128i res_even = convolve_lo_x(s, coeffs);

          // Filter odd-index pixels
          s[0] = _mm_srli_si128(data, 1);
          s[1] = _mm_srli_si128(data, 3);
          s[2] = _mm_srli_si128(data, 5);
          s[3] = _mm_srli_si128(data, 7);
          const __m128i res_odd = convolve_lo_x(s, coeffs);

          // Rearrange pixels back into the order 0 ... 7
          const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
          const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);
          __m128i res_lo_round = _mm_sra_epi32(
              _mm_add_epi32(res_lo, round_0_const), round_0_shift);
          res_lo_round = _mm_sra_epi32(_mm_add_epi32(res_lo_round, round_const),
                                       round_shift);
          __m128i res_hi_round = _mm_sra_epi32(
              _mm_add_epi32(res_hi, round_0_const), round_0_shift);
          res_hi_round = _mm_sra_epi32(_mm_add_epi32(res_hi_round, round_const),
                                       round_shift);

          const __m128i res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          const __m128i res = _mm_packus_epi16(res16, res16);

          _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
          j += 8;
        } while (j < w);
      } while (++i < h);
    }
  }
}